

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

IRHandler * __thiscall flow::IRProgram::createHandler(IRProgram *this,string *name)

{
  reference this_00;
  pointer pIVar1;
  undefined1 local_20 [16];
  string *name_local;
  IRProgram *this_local;
  
  local_20._8_8_ = name;
  name_local = (string *)this;
  std::make_unique<flow::IRHandler,std::__cxx11::string_const&,flow::IRProgram*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
             (IRProgram **)name);
  std::
  vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
  ::emplace_back<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>
            ((vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
              *)&this->handlers_,
             (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)local_20);
  std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::~unique_ptr
            ((unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)local_20);
  this_00 = std::
            vector<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
            ::back(&this->handlers_);
  pIVar1 = std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>::get(this_00);
  return pIVar1;
}

Assistant:

IRHandler* IRProgram::createHandler(const std::string& name) {
  handlers_.emplace_back(std::make_unique<IRHandler>(name, this));
  return handlers_.back().get();
}